

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void blend_a64_d16_mask_w8_sse41
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m128i *m,
               __m128i *v_round_offset,__m128i *v_maxval,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*in_RCX) [16];
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i res;
  __m128i res_e;
  __m128i res_hi;
  __m128i res_lo;
  __m128i s1;
  __m128i s0;
  __m128i max_minus_m;
  undefined8 local_258;
  
  auVar1 = vpsubw_avx(*in_R9,*in_RCX);
  auVar4 = auVar1;
  xx_loadu_128(in_RSI);
  auVar5 = auVar4;
  xx_loadu_128(in_RDX);
  auVar2 = vpunpcklwd_avx(auVar4,auVar5);
  auVar3 = vpunpcklwd_avx(*in_RCX,auVar1);
  auVar2 = vpmaddwd_avx(auVar2,auVar3);
  auVar3 = vpunpckhwd_avx(auVar4,auVar5);
  auVar1 = vpunpckhwd_avx(*in_RCX,auVar1);
  auVar1 = vpmaddwd_avx(auVar3,auVar1);
  auVar2 = vpsubd_avx(auVar2,*in_R8);
  auVar2 = vpsrad_avx(auVar2,ZEXT416((uint)res[1]));
  auVar1 = vpsubd_avx(auVar1,*in_R8);
  auVar1 = vpsrad_avx(auVar1,ZEXT416((uint)res[1]));
  auVar2 = vpackssdw_avx(auVar2,auVar1);
  auVar2 = vpackuswb_avx(auVar2,auVar2);
  local_258 = auVar2._0_8_;
  *in_RDI = local_258;
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w8_sse41(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m128i *m, const __m128i *v_round_offset, const __m128i *v_maxval,
    int shift) {
  const __m128i max_minus_m = _mm_sub_epi16(*v_maxval, *m);
  const __m128i s0 = xx_loadu_128(src0);
  const __m128i s1 = xx_loadu_128(src1);
  __m128i res_lo = _mm_madd_epi16(_mm_unpacklo_epi16(s0, s1),
                                  _mm_unpacklo_epi16(*m, max_minus_m));
  __m128i res_hi = _mm_madd_epi16(_mm_unpackhi_epi16(s0, s1),
                                  _mm_unpackhi_epi16(*m, max_minus_m));
  res_lo = _mm_srai_epi32(_mm_sub_epi32(res_lo, *v_round_offset), shift);
  res_hi = _mm_srai_epi32(_mm_sub_epi32(res_hi, *v_round_offset), shift);
  const __m128i res_e = _mm_packs_epi32(res_lo, res_hi);
  const __m128i res = _mm_packus_epi16(res_e, res_e);

  _mm_storel_epi64((__m128i *)(dst), res);
}